

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

void google::protobuf::internal::TcParser::WriteMapEntryAsUnknown
               (MessageLite *msg,TcParseTableBase *table,UntypedMapBase *map,uint32_t tag,
               NodeBase *node,MapAuxInfo map_info)

{
  uint8_t *puVar1;
  EpsCopyOutputStream *pEVar2;
  uint8_t *puVar3;
  bool bVar4;
  bool *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  uint *puVar6;
  unsigned_long *puVar7;
  int *piVar8;
  char *pcVar9;
  int line;
  void *data;
  int size;
  string serialized;
  CodedOutputStream coded_output;
  StringOutputStream string_output;
  LogMessageFatal local_d8;
  uint local_c4;
  string local_c0;
  MessageLite *local_a0;
  TcParseTableBase *local_98;
  CodedOutputStream local_90;
  StringOutputStream local_40;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_a0 = msg;
  local_98 = table;
  io::StringOutputStream::StringOutputStream(&local_40,&local_c0);
  local_90.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_90.impl_.buffer_;
  local_90.impl_.had_error_ = false;
  local_90.impl_.aliasing_enabled_ = false;
  local_90.impl_.skip_check_consistency = false;
  local_90.impl_.end_ = puVar1;
  local_90.impl_.buffer_end_ = puVar1;
  local_90.impl_.stream_ = &local_40.super_ZeroCopyOutputStream;
  local_90.cur_ = puVar1;
  local_90.start_count_ = io::StringOutputStream::ByteCount(&local_40);
  bVar4 = io::StringOutputStream::Next(&local_40,(void **)&local_d8,(int *)&local_c4);
  if (bVar4 && 0 < (int)local_c4) {
    puVar3 = (uint8_t *)
             CONCAT62(local_d8.super_LogMessage._2_6_,
                      CONCAT11(local_d8.super_LogMessage.errno_saver_.saved_errno_._1_1_,
                               (uint8_t)local_d8.super_LogMessage.errno_saver_.saved_errno_));
    pEVar2 = (EpsCopyOutputStream *)(puVar3 + -0x10);
    if ((int)local_c4 < 0x11) {
      pEVar2 = (EpsCopyOutputStream *)puVar1;
    }
    local_90.impl_.end_ = pEVar2->buffer_ + (ulong)local_c4 + -0x10;
    local_90.impl_.buffer_end_ = puVar3;
    local_90.cur_ = puVar1;
    if (0x10 < (int)local_c4) {
      local_90.impl_.buffer_end_ = (uint8_t *)0x0;
      local_90.cur_ = puVar3;
    }
  }
  local_d8.super_LogMessage.errno_saver_.saved_errno_._0_1_ = map_info.key_type_card.tag_;
  local_d8.super_LogMessage.errno_saver_.saved_errno_._1_1_ = map_info.key_type_card._1_1_;
  line = 0xa74;
  switch(map_info._0_4_ & 7) {
  case 0:
    line = 0x1f0;
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
    ;
    switch((map->type_info_).field_0x3 & 0xf) {
    case 0:
      pbVar5 = UntypedMapBase::GetKey<bool>(map,node);
      WireFormatLite::WriteBool(1,*pbVar5,&local_90);
      break;
    case 1:
      puVar6 = UntypedMapBase::GetKey<unsigned_int>(map,node);
      bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)&local_d8);
      if (bVar4) {
        WireFormatLite::WriteSInt32(1,*puVar6,&local_90);
      }
      else if ((local_d8.super_LogMessage.errno_saver_.saved_errno_._1_1_ & 1) == 0) {
        WireFormatLite::WriteUInt32(1,*puVar6,&local_90);
      }
      else {
        WireFormatLite::WriteInt32(1,*puVar6,&local_90);
      }
      break;
    case 2:
      puVar7 = UntypedMapBase::GetKey<unsigned_long>(map,node);
      bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)&local_d8);
      if (bVar4) {
        WireFormatLite::WriteSInt64(1,*puVar7,&local_90);
      }
      else if ((local_d8.super_LogMessage.errno_saver_.saved_errno_._1_1_ & 1) == 0) {
        WireFormatLite::WriteUInt64(1,*puVar7,&local_90);
      }
      else {
        WireFormatLite::WriteInt64(1,*puVar7,&local_90);
      }
      break;
    case 5:
      line = 0xa63;
      UntypedMapBase::GetKey<std::__cxx11::string>(map,node);
      pcVar9 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
      ;
    default:
switchD_0044d173_caseD_3:
      Unreachable(pcVar9,line);
    }
    break;
  case 1:
    puVar7 = UntypedMapBase::GetKey<unsigned_long>(map,node);
    WireFormatLite::WriteFixed64(1,*puVar7,&local_90);
    break;
  case 2:
    value = UntypedMapBase::GetKey<std::__cxx11::string>(map,node);
    WireFormatLite::WriteString(1,value,&local_90);
    break;
  default:
    pcVar9 = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    goto switchD_0044d173_caseD_3;
  case 5:
    puVar6 = UntypedMapBase::GetKey<unsigned_int>(map,node);
    WireFormatLite::WriteFixed32(1,*puVar6,&local_90);
  }
  if (((uint5)map_info & 0x1000000000) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0xa82,"map_info.value_is_validated_enum");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_d8);
  }
  piVar8 = UntypedMapBase::GetValue<int>(map,node);
  WireFormatLite::WriteInt32(2,*piVar8,&local_90);
  io::CodedOutputStream::~CodedOutputStream(&local_90);
  pcVar9 = (*local_98->fallback)
                     ((MessageLite *)0x0,(char *)0x0,(ParseContext *)0x0,(TcFieldData)0x0,
                      (TcParseTableBase *)0x0,0);
  (**(code **)(pcVar9 + 8))(local_a0,tag >> 3,local_c0._M_string_length,local_c0._M_dataplus._M_p);
  if (map->arena_ == (Arena *)0x0) {
    UntypedMapBase::DeleteNode(map,node);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TcParser::WriteMapEntryAsUnknown(MessageLite* msg,
                                      const TcParseTableBase* table,
                                      UntypedMapBase& map, uint32_t tag,
                                      NodeBase* node, MapAuxInfo map_info) {
  std::string serialized;
  {
    io::StringOutputStream string_output(&serialized);
    io::CodedOutputStream coded_output(&string_output);
    SerializeMapKey(map, node, map_info.key_type_card, coded_output);
    // The mapped_type is always an enum here.
    ABSL_DCHECK(map_info.value_is_validated_enum);
    WireFormatLite::WriteInt32(2, *map.GetValue<int32_t>(node), &coded_output);
  }
  GetUnknownFieldOps(table).write_length_delimited(msg, tag >> 3, serialized);

  if (map.arena() == nullptr) {
    map.DeleteNode(node);
  }
}